

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

int get_rep_len_format_ID(void *format_ID)

{
  byte bVar1;
  uint uVar2;
  char *__format;
  
  uVar2 = version_of_format_ID(format_ID);
  if (uVar2 < 2) {
    bVar1 = *format_ID;
    __format = "Format version %d has no size information \n";
  }
  else {
    if (uVar2 == 2) {
      return (uint)*(byte *)((long)format_ID + 1) * 0x40000 +
             (uint)(ushort)(*(ushort *)((long)format_ID + 2) << 8 |
                           *(ushort *)((long)format_ID + 2) >> 8) * 4;
    }
    bVar1 = *format_ID;
    __format = "Unknown format version %d\n";
  }
  printf(__format,(ulong)bVar1);
  return 0;
}

Assistant:

extern int
get_rep_len_format_ID(void *format_ID)
{
    switch (version_of_format_ID(format_ID)) {
    case 2:{
	    version_3_format_ID *id3 = (version_3_format_ID *) format_ID;
	    int rep_len = htons(id3->rep_len);
	    rep_len += (id3->top_byte_rep_len << 16);
	    return rep_len << 2;
	}
    case 0:
    case 1:
	printf("Format version %d has no size information \n",
	       *((unsigned char *) format_ID));
	break;
    default:
	printf("Unknown format version %d\n",
	       *((unsigned char *) format_ID));
	break;
    }
    return 0;
}